

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_expect_utf8_cstr_alloc(mpack_reader_t *reader,size_t maxsize)

{
  _Bool _Var1;
  char *str;
  size_t length;
  size_t maxsize_local;
  mpack_reader_t *reader_local;
  
  length = maxsize;
  maxsize_local = (size_t)reader;
  reader_local = (mpack_reader_t *)mpack_expect_cstr_alloc_unchecked(reader,maxsize,(size_t *)&str);
  if ((reader_local != (mpack_reader_t *)0x0) &&
     (_Var1 = mpack_utf8_check_no_null((char *)reader_local,(size_t)str), !_Var1)) {
    free(reader_local);
    mpack_reader_flag_error((mpack_reader_t *)maxsize_local,mpack_error_type);
    reader_local = (mpack_reader_t *)0x0;
  }
  return (char *)reader_local;
}

Assistant:

char* mpack_expect_utf8_cstr_alloc(mpack_reader_t* reader, size_t maxsize) {
    size_t length;
    char* str = mpack_expect_cstr_alloc_unchecked(reader, maxsize, &length);

    if (str && !mpack_utf8_check_no_null(str, length)) {
        MPACK_FREE(str);
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}